

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O3

void __thiscall cursespp::App::OnResized(App *this)

{
  IWindow *pIVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  element_type *peVar6;
  
  iVar2 = Screen::GetWidth();
  iVar3 = Screen::GetHeight();
  if ((iVar2 < this->minWidth) || (iVar3 < this->minHeight)) {
    Window::Freeze();
    return;
  }
  Window::Unfreeze();
  peVar6 = (this->state).layout.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar6 != (element_type *)0x0) {
    pIVar1 = (this->state).rootWindow;
    if (pIVar1 != (IWindow *)0x0) {
      uVar4 = Screen::GetWidth();
      uVar5 = Screen::GetHeight();
      (*(pIVar1->super_IOrderable)._vptr_IOrderable[0x15])(pIVar1,0,0,(ulong)uVar4,(ulong)uVar5);
      peVar6 = (this->state).layout.
               super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    (*(peVar6->super_IWindowGroup)._vptr_IWindowGroup[0x12])();
    peVar6 = (this->state).layout.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*(peVar6->super_IOrderable)._vptr_IOrderable[2])(&peVar6->super_IOrderable);
  }
  peVar6 = (this->state).overlay.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar6 != (element_type *)0x0) {
    (*(peVar6->super_IWindowGroup)._vptr_IWindowGroup[0x12])();
    peVar6 = (this->state).overlay.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*(peVar6->super_IOrderable)._vptr_IOrderable[2])(&peVar6->super_IOrderable);
    return;
  }
  return;
}

Assistant:

void App::OnResized() {
    int cx = Screen::GetWidth();
    int cy = Screen::GetHeight();
    if (cx < this->minWidth || cy < this->minHeight) {
        Window::Freeze();
    }
    else {
        Window::Unfreeze();

        if (this->state.layout) {
            if (this->state.rootWindow) {
                this->state.rootWindow->MoveAndResize(
                    0, 0, Screen::GetWidth(), Screen::GetHeight());
            }

            this->state.layout->Layout();
            this->state.layout->BringToTop();
        }

        if (this->state.overlay) {
            this->state.overlay->Layout();
            this->state.overlay->BringToTop();
        }
    }
}